

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectivesParser.cpp
# Opt level: O2

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
parseDirectiveDefineLabel(Parser *parser,int flags,optional<bool> thumbMode)

{
  bool bVar1;
  Token *this;
  Token *pTVar2;
  Identifier *symbol;
  undefined4 in_register_00000034;
  Parser *this_00;
  Expression value;
  undefined1 local_80 [8];
  Expression local_78;
  string local_60;
  Identifier local_40;
  
  this_00 = (Parser *)CONCAT44(in_register_00000034,flags);
  this = Parser::nextToken(this_00);
  if ((this->type != Identifier) || (pTVar2 = Parser::nextToken(this_00), pTVar2->type != Comma)) {
    (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
           (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
           parser;
  }
  Parser::parseExpression((Expression *)(local_80 + 8),this_00);
  if (local_78.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0) {
    symbol = Token::identifierValue(this);
    bVar1 = SymbolTable::isValidSymbolName(symbol);
    if (bVar1) {
      std::__cxx11::string::string((string *)&local_60,(string *)&this->originalText);
      Identifier::Identifier(&local_40,&local_60);
      std::
      make_unique<CAssemblerLabel,Identifier_const&,Identifier,Expression&,std::optional<bool>&>
                ((Identifier *)local_80,symbol,(Expression *)&local_40,
                 (optional<bool> *)(local_80 + 8));
      (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)local_80;
      local_80 = (undefined1  [8])0x0;
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_60);
      goto LAB_0016d2e4;
    }
    Parser::printError<Identifier>(this_00,this,"Invalid label name \"%s\"",symbol);
  }
  (parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
LAB_0016d2e4:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> parseDirectiveDefineLabel(Parser& parser, int flags, std::optional<bool> thumbMode)
{
	const Token& tok = parser.nextToken();
	if (tok.type != TokenType::Identifier)
		return nullptr;

	if (parser.nextToken().type != TokenType::Comma)
		return nullptr;

	Expression value = parser.parseExpression();
	if (!value.isLoaded())
		return nullptr;

	const Identifier &identifier = tok.identifierValue();
	if (!Global.symbolTable.isValidSymbolName(identifier))
	{
		parser.printError(tok, "Invalid label name \"%s\"",identifier);
		return nullptr;
	}

	return std::make_unique<CAssemblerLabel>(identifier,Identifier(tok.getOriginalText()),value,thumbMode);
}